

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

void __thiscall
OpenMD::
AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>::
AndParamConstraint(AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                   *this,GreaterThanOrEqualTo<int> *cons1,LessThanOrEqualToConstraint<int> *cons2)

{
  ostream *poVar1;
  stringstream iss;
  string asStack_1e8 [32];
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  (this->
  super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
  ).description_._M_dataplus._M_p =
       (pointer)&(this->
                 super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
                 ).description_.field_2;
  (this->
  super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
  ).description_._M_string_length = 0;
  (this->
  super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
  ).description_.field_2._M_local_buf[0] = '\0';
  GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo(&this->cons1_,cons1);
  LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint(&this->cons2_,cons2);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"(");
  std::__cxx11::string::string(asStack_1e8,(string *)&this->cons1_);
  poVar1 = std::operator<<(poVar1,asStack_1e8);
  poVar1 = std::operator<<(poVar1," and ");
  std::__cxx11::string::string(local_1c8,(string *)&this->cons2_);
  poVar1 = std::operator<<(poVar1,local_1c8);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(asStack_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,asStack_1e8);
  std::__cxx11::string::~string(asStack_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

AndParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << "(" << cons1_.getConstraintDescription() << " and "
          << cons2_.getConstraintDescription() << ")";
      this->description_ = iss.str();
    }